

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetPropertyDescriptor
               (RecyclableObject *object,PropertyId propId,PropertyDescriptor *descriptor)

{
  bool bVar1;
  Var getter;
  Var setter;
  
  if (descriptor->valueSpecified == true) {
    SetProperty(object,object,propId,(descriptor->Value).ptr,
                (((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr,PropertyOperation_None);
  }
  else if ((descriptor->getterSpecified != false) || (descriptor->setterSpecified == true)) {
    getter = PropertyDescriptor::GetGetter(descriptor);
    setter = PropertyDescriptor::GetSetter(descriptor);
    SetAccessors(object,propId,getter,setter,PropertyOperation_None);
  }
  if (descriptor->enumerableSpecified == true) {
    bVar1 = PropertyDescriptor::IsEnumerable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3d])(object,propId,(ulong)bVar1);
  }
  if (descriptor->configurableSpecified == true) {
    bVar1 = PropertyDescriptor::IsConfigurable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3c])(object,propId,(ulong)bVar1);
  }
  if (descriptor->writableSpecified == true) {
    bVar1 = PropertyDescriptor::IsWritable(descriptor);
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3b])(object,propId,(ulong)bVar1);
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::SetPropertyDescriptor(RecyclableObject* object, PropertyId propId, const PropertyDescriptor& descriptor)
    {
        if (descriptor.ValueSpecified())
        {
            ScriptContext* requestContext = object->GetScriptContext(); // Real requestContext?
            JavascriptOperators::SetProperty(object, object, propId, descriptor.GetValue(), requestContext);
        }
        else if (descriptor.GetterSpecified() || descriptor.SetterSpecified())
        {
            JavascriptOperators::SetAccessors(object, propId, descriptor.GetGetter(), descriptor.GetSetter());
        }

        if (descriptor.EnumerableSpecified())
        {
            object->SetEnumerable(propId, descriptor.IsEnumerable());
        }
        if (descriptor.ConfigurableSpecified())
        {
            object->SetConfigurable(propId, descriptor.IsConfigurable());
        }
        if (descriptor.WritableSpecified())
        {
            object->SetWritable(propId, descriptor.IsWritable());
        }

        return true;
    }